

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QFileInfo>>::
emplace<std::pair<QString,QFileInfo>const&>
          (QMovableArrayOps<std::pair<QString,QFileInfo>> *this,qsizetype i,
          pair<QString,_QFileInfo> *args)

{
  int *piVar1;
  Data *pDVar2;
  long lVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  long lVar7;
  long in_FS_OFFSET;
  Inserter local_80;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  undefined1 *apuStack_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = *(int **)this;
  if ((piVar1 == (int *)0x0) || (1 < *piVar1)) {
LAB_0061cbc7:
    apuStack_40[0] = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &((args->first).d.d)->super_QArrayData;
    pcStack_50 = (args->first).d.ptr;
    local_48 = (args->first).d.size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)local_58)->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((Data *)local_58)->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    QFileInfo::QFileInfo((QFileInfo *)apuStack_40,&args->second);
    lVar7 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,
               (uint)(i == 0 && lVar7 != 0),1,(pair<QString,_QFileInfo> **)0x0,
               (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
    qVar6 = local_48;
    pcVar5 = pcStack_50;
    pQVar4 = local_58;
    if (i == 0 && lVar7 != 0) {
      lVar7 = *(long *)(this + 8);
      local_58 = (QArrayData *)0x0;
      *(QArrayData **)(lVar7 + -0x20) = pQVar4;
      pcStack_50 = (char16_t *)0x0;
      *(char16_t **)(lVar7 + -0x18) = pcVar5;
      local_48 = 0;
      *(qsizetype *)(lVar7 + -0x10) = qVar6;
      QFileInfo::QFileInfo((QFileInfo *)(lVar7 + -8),(QFileInfo *)apuStack_40);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      local_80.displaceFrom = (pair<QString,_QFileInfo> *)(*(long *)(this + 8) + i * 0x20);
      local_80.displaceTo = (pair<QString,_QFileInfo> *)(*(long *)(this + 8) + i * 0x20 + 0x20);
      local_80.nInserts = 1;
      local_80.bytes = (*(long *)(this + 0x10) - i) * 0x20;
      local_80.data = (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this;
      memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
      qVar6 = local_48;
      pcVar5 = pcStack_50;
      pQVar4 = local_58;
      local_58 = (QArrayData *)0x0;
      ((local_80.displaceFrom)->first).d.d = (Data *)pQVar4;
      pcStack_50 = (char16_t *)0x0;
      ((local_80.displaceFrom)->first).d.ptr = pcVar5;
      local_48 = 0;
      ((local_80.displaceFrom)->first).d.size = qVar6;
      QFileInfo::QFileInfo(&(local_80.displaceFrom)->second,(QFileInfo *)apuStack_40);
      local_80.displaceFrom = local_80.displaceFrom + 1;
      QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::~Inserter(&local_80);
    }
    QFileInfo::~QFileInfo((QFileInfo *)apuStack_40);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  else {
    lVar7 = *(long *)(this + 0x10);
    if ((lVar7 == i && piVar1 != (int *)0x0) &&
       (*(long *)(piVar1 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar1 + 0x1fU & 0xfffffffffffffff0)) >> 5) + lVar7)) {
      lVar3 = *(long *)(this + 8);
      lVar7 = lVar7 * 0x20;
      pDVar2 = (args->first).d.d;
      *(Data **)(lVar3 + lVar7) = pDVar2;
      *(char16_t **)(lVar3 + 8 + lVar7) = (args->first).d.ptr;
      *(qsizetype *)(lVar3 + 0x10 + lVar7) = (args->first).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QFileInfo::QFileInfo((QFileInfo *)(lVar3 + lVar7 + 0x18),&args->second);
    }
    else {
      if (((i != 0) || (piVar1 == (int *)0x0)) ||
         (((long)piVar1 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_0061cbc7;
      lVar7 = *(long *)(this + 8);
      pDVar2 = (args->first).d.d;
      *(Data **)(lVar7 + -0x20) = pDVar2;
      *(char16_t **)(lVar7 + -0x18) = (args->first).d.ptr;
      *(qsizetype *)(lVar7 + -0x10) = (args->first).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QFileInfo::QFileInfo((QFileInfo *)(lVar7 + -8),&args->second);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }